

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu_util.c
# Opt level: O2

aom_codec_err_t
read_obu_size(uint8_t *data,size_t bytes_available,size_t *obu_size,size_t *length_field_size)

{
  int iVar1;
  aom_codec_err_t aVar2;
  uint64_t u_obu_size;
  
  u_obu_size = 0;
  iVar1 = aom_uleb_decode(data,bytes_available,&u_obu_size,length_field_size);
  aVar2 = AOM_CODEC_CORRUPT_FRAME;
  if ((iVar1 == 0) && (u_obu_size >> 0x20 == 0)) {
    *obu_size = u_obu_size;
    aVar2 = AOM_CODEC_OK;
  }
  return aVar2;
}

Assistant:

static aom_codec_err_t read_obu_size(const uint8_t *data,
                                     size_t bytes_available,
                                     size_t *const obu_size,
                                     size_t *const length_field_size) {
  uint64_t u_obu_size = 0;
  if (aom_uleb_decode(data, bytes_available, &u_obu_size, length_field_size) !=
      0) {
    return AOM_CODEC_CORRUPT_FRAME;
  }

  if (u_obu_size > UINT32_MAX) return AOM_CODEC_CORRUPT_FRAME;
  *obu_size = (size_t)u_obu_size;
  return AOM_CODEC_OK;
}